

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O0

bool sentencepiece::ModelProto_SentencePiece_Type_Parse
               (ConstStringParam name,ModelProto_SentencePiece_Type *value)

{
  bool bVar1;
  undefined4 *in_RSI;
  bool success;
  int int_value;
  EnumEntry *in_stack_00000028;
  undefined1 in_stack_00000030 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  StringPiece *in_stack_ffffffffffffffe0;
  undefined4 local_14;
  
  google::protobuf::StringPiece::StringPiece<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  bVar1 = google::protobuf::internal::LookUpEnumValue
                    (in_stack_00000028,(size_t)name,(StringPiece)in_stack_00000030,(int *)value);
  if (bVar1) {
    *in_RSI = local_14;
  }
  return bVar1;
}

Assistant:

bool ModelProto_SentencePiece_Type_Parse(
    ::PROTOBUF_NAMESPACE_ID::ConstStringParam name, ModelProto_SentencePiece_Type* value) {
  int int_value;
  bool success = ::PROTOBUF_NAMESPACE_ID::internal::LookUpEnumValue(
      ModelProto_SentencePiece_Type_entries, 6, name, &int_value);
  if (success) {
    *value = static_cast<ModelProto_SentencePiece_Type>(int_value);
  }
  return success;
}